

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O3

void __thiscall
amrex::YAFluxRegister::CrseAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *flux,Real *dx,
          Real dt,RunOn runon)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  FArrayBox *pFVar12;
  FArrayBox *pFVar13;
  FArrayBox *pFVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  double *pdVar27;
  long lVar28;
  long lVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  Array4<double> fab;
  Array4<int> flag;
  long local_2b0;
  Box local_f4;
  double local_d8;
  double local_c8;
  Array4<double> local_b0;
  Array4<int> local_70;
  
  piVar18 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar18 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar18;
  }
  if ((this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [*piVar18] != 0) {
    MFIter::tilebox(&local_f4,mfi);
    local_c8 = dt / *dx;
    local_d8 = dt / dx[1];
    dVar1 = dx[2];
    uVar2 = (this->m_crse_data).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
    uVar42 = (ulong)uVar2;
    pFVar12 = flux->_M_elems[0];
    pFVar13 = flux->_M_elems[1];
    pFVar14 = flux->_M_elems[2];
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_b0,(FabArray<amrex::FArrayBox> *)this,mfi);
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              (&local_70,&(this->m_crse_flag).super_FabArray<amrex::IArrayBox>,mfi);
    local_2b0 = (long)local_f4.smallend.vect[2];
    if (local_f4.smallend.vect[2] <= local_f4.bigend.vect[2]) {
      pdVar15 = (pFVar12->super_BaseFab<double>).dptr;
      iVar3 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[0];
      iVar4 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[1];
      iVar5 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[2];
      lVar19 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
      lVar34 = (((pFVar12->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1) * lVar19;
      pdVar16 = (pFVar13->super_BaseFab<double>).dptr;
      iVar6 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
      iVar7 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
      iVar8 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[2];
      lVar20 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
      lVar36 = (((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1) * lVar20;
      pdVar17 = (pFVar14->super_BaseFab<double>).dptr;
      iVar9 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[0];
      iVar10 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[1];
      iVar11 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[2];
      lVar21 = (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[0] - iVar9) + 1);
      lVar39 = (((pFVar14->super_BaseFab<double>).domain.bigend.vect[1] - iVar10) + 1) * lVar21;
      lVar41 = (((pFVar12->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1) * lVar34;
      lVar29 = (((pFVar13->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1) * lVar36;
      lVar28 = (((pFVar14->super_BaseFab<double>).domain.bigend.vect[2] - iVar11) + 1) * lVar39;
      do {
        if (local_f4.smallend.vect[1] <= local_f4.bigend.vect[1]) {
          lVar37 = (local_2b0 - local_70.begin.z) * local_70.kstride;
          lVar22 = (local_2b0 - iVar5) * lVar34;
          lVar23 = (local_2b0 - iVar8) * lVar36;
          lVar33 = (long)local_f4.smallend.vect[1];
          do {
            if (local_f4.smallend.vect[0] <= local_f4.bigend.vect[0]) {
              lVar24 = (lVar33 - local_70.begin.y) * local_70.jstride;
              lVar25 = (lVar33 - iVar4) * lVar19;
              lVar40 = (long)local_b0.begin.x;
              lVar35 = (lVar33 - local_b0.begin.y) * local_b0.jstride;
              lVar38 = (local_2b0 - local_b0.begin.z) * local_b0.kstride;
              lVar32 = (lVar33 - iVar10) * lVar21;
              lVar31 = (long)local_f4.smallend.vect[0];
              do {
                lVar43 = lVar31 - local_70.begin.x;
                if (local_70.p[lVar24 + lVar43 + lVar37] == 1) {
                  if (local_70.p[lVar24 + lVar37 + (~local_70.begin.x + (int)lVar31)] == 2 &&
                      0 < (int)uVar2) {
                    pdVar30 = pdVar15 + lVar22 + lVar25 + (lVar31 - iVar3);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * -local_c8 + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar41;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  if (local_70.p[lVar24 + lVar37 + ((lVar31 + 1) - (long)local_70.begin.x)] == 2 &&
                      0 < (int)uVar2) {
                    pdVar30 = pdVar15 + lVar22 + lVar25 + ((lVar31 + 1) - (long)iVar3);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * local_c8 + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar41;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  if (local_70.p
                      [lVar37 + (~local_70.begin.y + (int)lVar33) * local_70.jstride + lVar43] == 2
                      && 0 < (int)uVar2) {
                    pdVar30 = pdVar16 + lVar23 + (lVar33 - iVar7) * lVar20 + (lVar31 - iVar6);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * -local_d8 + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar29;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  if (local_70.p
                      [lVar37 + ((lVar33 + 1) - (long)local_70.begin.y) * local_70.jstride + lVar43]
                      == 2 && 0 < (int)uVar2) {
                    pdVar30 = pdVar16 + lVar23 + ((lVar33 + 1) - (long)iVar7) * lVar20 +
                                                 (lVar31 - iVar6);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * local_d8 + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar29;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  if (local_70.p
                      [lVar24 + lVar43 + (~local_70.begin.z + (int)local_2b0) * local_70.kstride] ==
                      2 && 0 < (int)uVar2) {
                    pdVar30 = pdVar17 + (local_2b0 - iVar11) * lVar39 + lVar32 + (lVar31 - iVar9);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * -(dt / dVar1) + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar28;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  if (local_70.p
                      [lVar24 + lVar43 + ((local_2b0 + 1) - (long)local_70.begin.z) *
                                         local_70.kstride] == 2 && 0 < (int)uVar2) {
                    pdVar30 = pdVar17 + ((local_2b0 + 1) - (long)iVar11) * lVar39 +
                                        lVar32 + (lVar31 - iVar9);
                    pdVar27 = local_b0.p + lVar35 + lVar38 + (lVar31 - lVar40);
                    uVar26 = uVar42;
                    do {
                      *pdVar27 = *pdVar30 * (dt / dVar1) + *pdVar27;
                      pdVar27 = pdVar27 + local_b0.nstride;
                      pdVar30 = pdVar30 + lVar28;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                }
                lVar31 = lVar31 + 1;
              } while (local_f4.bigend.vect[0] + 1 != (int)lVar31);
            }
            lVar33 = lVar33 + 1;
          } while (local_f4.bigend.vect[1] + 1 != (int)lVar33);
        }
        local_2b0 = local_2b0 + 1;
      } while (local_f4.bigend.vect[2] + 1 != (int)local_2b0);
    }
  }
  return;
}

Assistant:

void
YAFluxRegister::CrseAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_crse_data.nComp() == flux[0]->nComp());

    if (m_crse_fab_flag[mfi.LocalIndex()] == crse_cell) {
        return;  // this coarse fab is not close to fine fabs.
    }

    const Box& bx = mfi.tilebox();
    const int nc = m_crse_data.nComp();
    AMREX_D_TERM(const Real dtdx = dt/dx[0];,
                 const Real dtdy = dt/dx[1];,
                 const Real dtdz = dt/dx[2];);
    AMREX_D_TERM(FArrayBox const* fx = flux[0];,
                 FArrayBox const* fy = flux[1];,
                 FArrayBox const* fz = flux[2];);

    auto fab = m_crse_data.array(mfi);
    auto const flag = m_crse_flag.array(mfi);

    AMREX_D_TERM(Array4<Real const> fxarr = fx->const_array();,
                 Array4<Real const> fyarr = fy->const_array();,
                 Array4<Real const> fzarr = fz->const_array(););

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, bx, tbx,
    {
        yafluxreg_crseadd(tbx, fab, flag, AMREX_D_DECL(fxarr,fyarr,fzarr),
                          AMREX_D_DECL(dtdx,dtdy,dtdz),nc);
    });
}